

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssemblyCommand.cpp
# Opt level: O2

void onlyLeftProcessMemoryTemps
               (AssemblyCommands *newAssemblyCommands,
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *spilledToOffset,CTemp *beginSP,shared_ptr<AssemblyCode::AssemblyCommand> *thisShared
               ,CTemp *leftOperand,bool shouldLoadLeft,bool shouldStoreLeft)

{
  iterator iVar1;
  CTemp leftTemp;
  string leftName;
  string local_90;
  string local_70;
  string local_50;
  
  IRT::CTemp::ToString_abi_cxx11_(&local_50,leftOperand);
  IRT::CTemp::ToString_abi_cxx11_(&local_70,leftOperand);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&spilledToOffset->_M_t,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  if ((_Rb_tree_header *)iVar1._M_node == &(spilledToOffset->_M_t)._M_impl.super__Rb_tree_header) {
    std::
    vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
    ::push_back(newAssemblyCommands,thisShared);
  }
  else {
    IRT::CTemp::CTemp((CTemp *)&local_70);
    if (shouldLoadLeft) {
      createLoad((CTemp *)&local_90,(int)&local_70,(CTemp *)(ulong)iVar1._M_node[2]._M_color);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::AssemblyCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)newAssemblyCommands,(shared_ptr<AssemblyCode::AssemblyCommand> *)&local_90);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90._M_string_length);
    }
    IRT::CTemp::ToString_abi_cxx11_(&local_90,(CTemp *)&local_70);
    std::__cxx11::string::operator=((string *)&local_50,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::
    vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,_std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>_>_>
    ::push_back(newAssemblyCommands,thisShared);
    if (shouldStoreLeft) {
      createStore((CTemp *)&local_90,(int)&local_70,(CTemp *)(ulong)iVar1._M_node[2]._M_color);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::AssemblyCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)newAssemblyCommands,(shared_ptr<AssemblyCode::AssemblyCommand> *)&local_90);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_90._M_string_length);
    }
    std::__cxx11::string::~string((string *)&local_70);
  }
  IRT::CTemp::setName(leftOperand,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void onlyLeftProcessMemoryTemps(AssemblyCommands &newAssemblyCommands,
                                 std::map<std::string, int> &spilledToOffset,
                                 IRT::CTemp& beginSP,
                                 std::shared_ptr<AssemblyCode::AssemblyCommand> thisShared,
                                 IRT::CTemp& leftOperand,
                                 bool shouldLoadLeft = true,
                                 bool shouldStoreLeft = true) {

    std::string leftName = leftOperand.ToString();

    auto leftFind = spilledToOffset.find(leftOperand.ToString());

    if (leftFind != spilledToOffset.end()) {
        IRT::CTemp leftTemp;
        if (shouldLoadLeft) {
            newAssemblyCommands.push_back( createLoad( leftTemp, leftFind->second, beginSP ));
        }
        leftName = leftTemp.ToString();

        newAssemblyCommands.push_back(thisShared);

        if (shouldStoreLeft) {
            newAssemblyCommands.push_back( createStore( leftTemp, leftFind->second, beginSP ));
        }
    } else {
        newAssemblyCommands.push_back(thisShared);
    }

    leftOperand.setName(leftName);
}